

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

Matrix * __thiscall sptk::Matrix::operator-(Matrix *this)

{
  Matrix *in_RSI;
  Matrix *in_RDI;
  Matrix *in_stack_00000008;
  Matrix *in_stack_00000010;
  Matrix *result;
  
  Matrix(in_stack_00000010,in_stack_00000008);
  Negate(in_RSI);
  return in_RDI;
}

Assistant:

Matrix Matrix::operator-() const {
  Matrix result(*this);
  result.Negate();
  return result;
}